

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdb.c
# Opt level: O0

int mdb_pages_xkeep(MDB_cursor *mc,uint pflags,int all)

{
  pgno_t pgno_00;
  MDB_xcursor *pMVar1;
  int iVar2;
  pgno_t pgno;
  int level;
  int rc;
  uint j;
  uint i;
  MDB_node *leaf;
  MDB_page *mp;
  MDB_page *dp;
  MDB_xcursor *mx;
  MDB_cursor *m0;
  MDB_cursor *m3;
  MDB_txn *txn;
  int all_local;
  uint pflags_local;
  MDB_cursor *mc_local;
  
  m3 = (MDB_cursor *)mc->mc_txn;
  _all_local = mc;
  if ((mc->mc_flags & 0x40) != 0) {
    _all_local = (MDB_cursor *)0x0;
  }
  rc = *(int *)((anon_union_8_2_9802fc59_for_mt_u *)m3->mc_pg + 6);
  while( true ) {
    for (; _all_local != (MDB_cursor *)0x0; _all_local = _all_local->mc_next) {
      if ((_all_local->mc_flags & 1) != 0) {
        m0 = _all_local;
        pMVar1 = (MDB_xcursor *)m0;
        do {
          m0 = &pMVar1->mx_cursor;
          leaf = (MDB_node *)0x0;
          for (level = 0; (uint)level < (uint)m0->mc_snum; level = level + 1) {
            leaf = (MDB_node *)m0->mc_pg[(uint)level];
            if ((((MDB_page *)leaf)->mp_flags & 0xc050) == pflags) {
              ((MDB_page *)leaf)->mp_flags = ((MDB_page *)leaf)->mp_flags ^ 0x8000;
            }
          }
          dp = (MDB_page *)m0->mc_xcursor;
        } while (((((MDB_xcursor *)dp != (MDB_xcursor *)0x0) &&
                  ((*(uint *)((long)&((MDB_xcursor *)dp)->mx_cursor + 0x44) & 1) != 0)) &&
                 (leaf != (MDB_node *)0x0)) &&
                (((leaf[1].mn_lo & 2) != 0 &&
                 (_j = leaf->mn_data +
                       (long)(int)(uint)*(ushort *)
                                         (leaf[1].mn_data + (ulong)m0->mc_ki[level - 1] * 2 + -2) +
                       -8, pMVar1 = (MDB_xcursor *)dp, (*(ushort *)(_j + 4) & 2) != 0))));
      }
    }
    if (rc == 0) break;
    rc = rc - 1;
    _all_local = *(MDB_cursor **)
                  ((long)((anon_union_8_2_9802fc59_for_mt_u *)m3->mc_pg)[4].dirty_list +
                  (ulong)(uint)rc * 8);
  }
  if (all != 0) {
    mx = (MDB_xcursor *)mc;
    txn._0_4_ = all;
    txn._4_4_ = pflags;
    for (rc = 0; pgno._4_4_ = 0, (uint)rc < *(uint *)(m3->mc_pg + 6); rc = rc + 1) {
      if (((*(byte *)((long)m3->mc_pg[5]->mp_ptrs + ((ulong)(uint)rc - 0x10)) & 1) != 0) &&
         (pgno_00 = *(pgno_t *)m3->mc_pg[2][(ulong)(uint)rc * 2 + 1].mp_ptrs,
         pgno_00 != 0xffffffffffffffff)) {
        iVar2 = mdb_page_get(&mx->mx_cursor,pgno_00,&mp,(int *)&pgno);
        if (iVar2 != 0) {
          return iVar2;
        }
        if (((mp->mp_flags & 0xc050) == txn._4_4_) && ((int)pgno < 2)) {
          mp->mp_flags = mp->mp_flags ^ 0x8000;
        }
      }
    }
  }
  return 0;
}

Assistant:

static int
mdb_pages_xkeep(MDB_cursor *mc, unsigned pflags, int all)
{
	enum { Mask = P_SUBP|P_DIRTY|P_LOOSE|P_KEEP };
	MDB_txn *txn = mc->mc_txn;
	MDB_cursor *m3, *m0 = mc;
	MDB_xcursor *mx;
	MDB_page *dp, *mp;
	MDB_node *leaf;
	unsigned i, j;
	int rc = MDB_SUCCESS, level;

	/* Mark pages seen by cursors */
	if (mc->mc_flags & C_UNTRACK)
		mc = NULL;				/* will find mc in mt_cursors */
	for (i = txn->mt_numdbs;; mc = txn->mt_cursors[--i]) {
		for (; mc; mc=mc->mc_next) {
			if (!(mc->mc_flags & C_INITIALIZED))
				continue;
			for (m3 = mc;; m3 = &mx->mx_cursor) {
				mp = NULL;
				for (j=0; j<m3->mc_snum; j++) {
					mp = m3->mc_pg[j];
					if ((mp->mp_flags & Mask) == pflags)
						mp->mp_flags ^= P_KEEP;
				}
				mx = m3->mc_xcursor;
				/* Proceed to mx if it is at a sub-database */
				if (! (mx && (mx->mx_cursor.mc_flags & C_INITIALIZED)))
					break;
				if (! (mp && (mp->mp_flags & P_LEAF)))
					break;
				leaf = NODEPTR(mp, m3->mc_ki[j-1]);
				if (!(leaf->mn_flags & F_SUBDATA))
					break;
			}
		}
		if (i == 0)
			break;
	}

	if (all) {
		/* Mark dirty root pages */
		for (i=0; i<txn->mt_numdbs; i++) {
			if (txn->mt_dbflags[i] & DB_DIRTY) {
				pgno_t pgno = txn->mt_dbs[i].md_root;
				if (pgno == P_INVALID)
					continue;
				if ((rc = mdb_page_get(m0, pgno, &dp, &level)) != MDB_SUCCESS)
					break;
				if ((dp->mp_flags & Mask) == pflags && level <= 1)
					dp->mp_flags ^= P_KEEP;
			}
		}
	}

	return rc;
}